

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O3

void __thiscall
Disa::Vector_Dense<double,_2UL>::Vector_Dense
          (Vector_Dense<double,_2UL> *this,function<double_(unsigned_long)> *lambda,size_t size)

{
  bool bVar1;
  ostream *poVar2;
  source_location *in_RCX;
  bool bVar3;
  char *pcVar4;
  double dVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  
  if (size == 2) {
    pcVar4 = (char *)0x0;
    bVar3 = true;
    while (local_50._M_dataplus._M_p = pcVar4,
          (lambda->super__Function_base)._M_manager != (_Manager_type)0x0) {
      dVar5 = (*lambda->_M_invoker)((_Any_data *)lambda,(unsigned_long *)&local_50);
      (this->super_array<double,_2UL>)._M_elems[(long)pcVar4] = dVar5;
      pcVar4 = (char *)0x1;
      bVar1 = !bVar3;
      bVar3 = false;
      if (bVar1) {
        return;
      }
    }
    std::__throw_bad_function_call();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_30 = &PTR_s__workspace_llm4binary_github_lic_00162810;
  console_format_abi_cxx11_(&local_50,(Disa *)0x0,(Log_Level)&local_30,in_RCX);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Cannot change the size for a static vector.",0x2b);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  exit(1);
}

Assistant:

explicit Vector_Dense(const std::function<_type(const std::size_t)>& lambda, std::size_t size = _size) {
    ASSERT_DEBUG(size == _size, "Cannot change the size for a static vector.");
    FOR(i_element, this->size())(*this)[i_element] = lambda(i_element);
  }